

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.cpp
# Opt level: O2

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject **block;
  GCObject *pGVar2;
  GCObject **ppGVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  GCObject *pGVar7;
  long lVar8;
  
  if (L->l_G->gcstate != '\x02') {
    if (newsize < -1) {
      ppGVar3 = (GCObject **)luaM_toobig(L);
    }
    else {
      ppGVar3 = (GCObject **)luaM_realloc_(L,(void *)0x0,0,(long)newsize * 8);
    }
    pgVar1 = L->l_G;
    uVar4 = 0;
    uVar6 = 0;
    if (0 < newsize) {
      uVar6 = (ulong)(uint)newsize;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      ppGVar3[uVar4] = (GCObject *)0x0;
    }
    lVar5 = 0;
    while( true ) {
      lVar8 = (long)(pgVar1->strt).size;
      block = (pgVar1->strt).hash;
      if (lVar8 <= lVar5) break;
      pGVar7 = block[lVar5];
      while (pGVar7 != (GCObject *)0x0) {
        pGVar2 = (pGVar7->gch).next;
        uVar4 = (long)*(int *)((long)pGVar7 + 0xc) & (long)newsize - 1U;
        (pGVar7->gch).next = ppGVar3[uVar4];
        ppGVar3[uVar4] = pGVar7;
        pGVar7 = pGVar2;
      }
      lVar5 = lVar5 + 1;
    }
    luaM_realloc_(L,block,lVar8 << 3,0);
    (pgVar1->strt).size = newsize;
    (pgVar1->strt).hash = ppGVar3;
  }
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  GCObject **newhash;
  stringtable *tb;
  int i;
  if (G(L)->gcstate == GCSsweepstring)
    return;  /* cannot resize during GC traverse */
  newhash = luaM_newvector(L, newsize, GCObject *);
  tb = &G(L)->strt;
  for (i=0; i<newsize; i++) newhash[i] = NULL;
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    while (p) {  /* for each node in the list */
      GCObject *next = p->gch.next;  /* save next */
      unsigned int h = gco2ts(p)->hash;
      int h1 = lmod(h, newsize);  /* new position */
      lua_assert(cast_int(h%newsize) == lmod(h, newsize));
      p->gch.next = newhash[h1];  /* chain it */
      newhash[h1] = p;
      p = next;
    }
  }
  luaM_freearray(L, tb->hash, tb->size, TString *);
  tb->size = newsize;
  tb->hash = newhash;
}